

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  uint8_t type;
  int iVar1;
  roaring64_bitmap_t *art;
  art_val_t *val;
  container_t *pcVar2;
  art_val_t *paVar3;
  int *c;
  int *piVar4;
  uint8_t uVar5;
  long lVar6;
  art_iterator_t *paVar7;
  art_iterator_t it1;
  art_iterator_t it2;
  art_iterator_t aStack_138;
  art_iterator_t local_b0;
  
  art = (roaring64_bitmap_t *)roaring_malloc(0x10);
  (art->art).root = (art_node_t *)0x0;
  art->flags = '\0';
  art_init_iterator(&aStack_138,&r1->art,true);
  art_init_iterator(&local_b0,&r2->art,true);
  do {
    if (aStack_138.value == (art_val_t *)0x0) {
      return art;
    }
    if (local_b0.value == (art_val_t *)0x0) {
LAB_00107bba:
      paVar3 = aStack_138.value;
      val = (art_val_t *)roaring_malloc(0x10);
      val[1].key[0] = paVar3[1].key[0];
      pcVar2 = get_copy_of_container(*(container_t **)(paVar3[1].key + 2),val[1].key,false);
      *(container_t **)(val[1].key + 2) = pcVar2;
      art_insert((art_t *)art,aStack_138.key,val);
      paVar7 = &aStack_138;
    }
    else {
      iVar1 = art_compare_keys(aStack_138.key,local_b0.key);
      paVar7 = &local_b0;
      if (iVar1 == 0) {
        paVar3 = (art_val_t *)roaring_malloc(0x10);
        c = (int *)container_andnot(*(container_t **)(aStack_138.value[1].key + 2),
                                    aStack_138.value[1].key[0],
                                    *(container_t **)(local_b0.value[1].key + 2),
                                    local_b0.value[1].key[0],paVar3[1].key);
        *(int **)(paVar3[1].key + 2) = c;
        type = paVar3[1].key[0];
        piVar4 = c;
        uVar5 = type;
        if (type == '\x04') {
          uVar5 = (uint8_t)c[2];
          piVar4 = *(int **)c;
        }
        iVar1 = *piVar4;
        if ((uVar5 == '\x03') || (uVar5 == '\x02')) {
          if (iVar1 < 1) goto LAB_00107c83;
LAB_00107c98:
          art_insert((art_t *)art,aStack_138.key,paVar3);
        }
        else {
          if (iVar1 != 0) {
            if (iVar1 != -1) goto LAB_00107c98;
            lVar6 = 0;
            do {
              if (*(long *)(*(long *)(piVar4 + 2) + lVar6 * 8) != 0) goto LAB_00107c98;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x400);
          }
LAB_00107c83:
          container_free(c,type);
          roaring_free(paVar3);
        }
        art_iterator_next(&aStack_138);
      }
      else if (iVar1 < 0) goto LAB_00107bba;
    }
    art_iterator_next(paVar7);
  } while( true );
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                result_leaf->container = container_andnot(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);

                if (container_nonzero_cardinality(result_leaf->container,
                                                  result_leaf->typecode)) {
                    art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                } else {
                    container_free(result_leaf->container,
                                   result_leaf->typecode);
                    free_leaf(result_leaf);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}